

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Name> *
wasm::WATParser::maybeMemuse<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Name *u;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_f9;
  string local_f8;
  Err local_d8;
  uint local_b4;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> idx;
  ParseDefsCtx *ctx_local;
  
  expected = sv("memory",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
    memidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)__return_storage_ptr___00,ctx);
    Result<wasm::Name>::Result
              ((Result<wasm::Name> *)local_78,(Result<wasm::Name> *)__return_storage_ptr___00);
    local_90 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_78);
    bVar1 = local_90 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Name>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    local_b4 = (uint)bVar1;
    Result<wasm::Name>::~Result((Result<wasm::Name> *)local_78);
    if (local_b4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        u = Result<wasm::Name>::operator*
                      ((Result<wasm::Name> *)
                       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                               super__Move_assign_alias<wasm::Name,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        MaybeResult<wasm::Name>::MaybeResult<wasm::Name&>(__return_storage_ptr__,u);
        local_b4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected end of memory use",&local_f9);
        Lexer::err(&local_d8,&ctx->in,&local_f8);
        MaybeResult<wasm::Name>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        local_b4 = 1;
      }
    }
    Result<wasm::Name>::~Result
              ((Result<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Name>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::MemoryIdxT> maybeMemuse(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }
  auto idx = memidx(ctx);
  CHECK_ERR(idx);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory use");
  }
  return *idx;
}